

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_ffi_tapi.cpp
# Opt level: O3

void __thiscall
TradeApi::on_account_status(TradeApi *this,shared_ptr<tquant::api::AccountInfo> *account)

{
  TradeApiCallback *pTVar1;
  element_type *peVar2;
  AccountInfo c_account;
  AccountInfo local_30;
  
  pTVar1 = this->cb;
  if (pTVar1 != (TradeApiCallback *)0x0) {
    peVar2 = (account->super___shared_ptr<tquant::api::AccountInfo,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    local_30.account_id = (peVar2->account_id)._M_dataplus._M_p;
    local_30.broker = (peVar2->broker)._M_dataplus._M_p;
    local_30.status = (peVar2->status)._M_dataplus._M_p;
    local_30.msg = (peVar2->msg)._M_dataplus._M_p;
    local_30.account_type = (peVar2->account_type)._M_dataplus._M_p;
    local_30.account = local_30.broker;
    (*pTVar1->on_account_status)(&local_30,pTVar1->user_data);
  }
  return;
}

Assistant:

virtual void on_account_status(shared_ptr<tquant::api::AccountInfo> account) override {
        if (cb) {
            AccountInfo c_account;
            init_caccount(&c_account, account.get());
            cb->on_account_status(&c_account, cb->user_data);
        }
    }